

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_bpe_session::add_new_bigram(llm_tokenizer_bpe_session *this,int left,int right)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  value_type *__x;
  llm_bigram_bpe bigram;
  int rank_found;
  string right_token;
  string left_token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d0 [24];
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  llama_vocab *in_stack_ffffffffffffff58;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  int local_10;
  int local_c;
  
  if ((in_ESI != -1) && (in_EDX != -1)) {
    local_10 = in_EDX;
    local_c = in_ESI;
    pvVar4 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                        (long)in_ESI);
    pcVar1 = pvVar4->text;
    pvVar4 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)(in_RDI + 0x10),
                        (long)local_c);
    uVar2 = pvVar4->n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,uVar2,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    __x = (value_type *)(in_RDI + 0x10);
    pvVar4 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)__x,(long)local_10);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar4->text;
    pvVar4 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)__x,(long)local_10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar4->n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,(char *)__rhs,(ulong)__lhs,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    iVar3 = llama_vocab::find_bpe_rank
                      (in_stack_ffffffffffffff58,
                       (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
    if (-1 < iVar3) {
      llm_bigram_bpe::llm_bigram_bpe((llm_bigram_bpe *)0x546650);
      std::operator+(__lhs,__rhs);
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffff58,local_d0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      llama_vocab::std::
      priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ::push((priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
              *)__rhs,__x);
      llm_bigram_bpe::~llm_bigram_bpe((llm_bigram_bpe *)0x54670e);
    }
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void add_new_bigram(int left, int right) {
        if (left == -1 || right == -1) {
            return;
        }
        std::string left_token  = std::string(symbols[left].text,  symbols[left].n);
        std::string right_token = std::string(symbols[right].text, symbols[right].n);

        int rank_found = -1;

        rank_found = vocab.find_bpe_rank(left_token, right_token);

        if (rank_found < 0) {
            return;
        }

        llm_bigram_bpe bigram;

        bigram.left  = left;
        bigram.right = right;
        bigram.text  = left_token + right_token;
        bigram.size  = left_token.size() + right_token.size();
        bigram.rank  = rank_found;

        work_queue.push(bigram);
    }